

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.h
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionEulerSimple::SetAsCircularSection
          (ChBeamSectionEulerSimple *this,double diameter)

{
  double __x;
  double dVar1;
  undefined1 auVar2 [16];
  
  __x = diameter * 0.5;
  this->Area = __x * __x * 3.141592653589793;
  dVar1 = pow(__x,4.0);
  dVar1 = dVar1 * 0.7853981633974483;
  this->Izz = dVar1;
  this->Iyy = dVar1;
  this->J = dVar1 + dVar1;
  dVar1 = this->E / (this->G + this->G) + -1.0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar1;
  auVar2 = vfmadd213sd_fma(ZEXT816(0x4018000000000000),auVar2,ZEXT816(0x401c000000000000));
  dVar1 = ((dVar1 + 1.0) * 6.0) / auVar2._0_8_;
  this->Ks_y = dVar1;
  this->Ks_z = dVar1;
  ChBeamSection::SetDrawCircularRadius((ChBeamSection *)this,__x);
  return;
}

Assistant:

void SetAsCircularSection(double diameter) {
        this->Area = CH_C_PI * pow((0.5 * diameter), 2);
        this->Izz = (CH_C_PI / 4.0) * pow((0.5 * diameter), 4);
        this->Iyy = Izz;

        // exact expression for circular beam J = Ixx ,
        // where for polar theorem Ixx = Izz+Iyy
        this->J = Izz + Iyy;

        // set Ks using Timoshenko-Gere formula for solid circular shape
        double poisson = this->E / (2.0 * this->G) - 1.0;
        this->Ks_y = 6.0 * (1.0 + poisson) / (7.0 + 6.0 * poisson);
        this->Ks_z = this->Ks_y;

        this->SetDrawCircularRadius(diameter / 2);
    }